

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

TSpirvRequirement * __thiscall
glslang::TParseContext::mergeSpirvRequirements
          (TParseContext *this,TSourceLoc *loc,TSpirvRequirement *spirvReq1,
          TSpirvRequirement *spirvReq2)

{
  bool bVar1;
  TSpirvRequirement *spirvReq2_local;
  TSpirvRequirement *spirvReq1_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                   *)spirvReq2);
  if (!bVar1) {
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                     *)spirvReq1);
    if (bVar1) {
      TSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
      ::operator=(&spirvReq1->extensions,&spirvReq2->extensions);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many SPIR-V requirements","extensions","");
    }
  }
  bVar1 = std::set<int,_std::less<int>,_glslang::pool_allocator<int>_>::empty
                    (&(spirvReq2->capabilities).
                      super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>);
  if (!bVar1) {
    bVar1 = std::set<int,_std::less<int>,_glslang::pool_allocator<int>_>::empty
                      (&(spirvReq1->capabilities).
                        super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>);
    if (bVar1) {
      TSet<int,_std::less<int>_>::operator=(&spirvReq1->capabilities,&spirvReq2->capabilities);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many SPIR-V requirements","capabilities","");
    }
  }
  return spirvReq1;
}

Assistant:

TSpirvRequirement* TParseContext::mergeSpirvRequirements(const TSourceLoc& loc, TSpirvRequirement* spirvReq1,
                                                         TSpirvRequirement* spirvReq2)
{
    // Merge the second SPIR-V requirement to the first one
    if (!spirvReq2->extensions.empty()) {
        if (spirvReq1->extensions.empty())
            spirvReq1->extensions = spirvReq2->extensions;
        else
            error(loc, "too many SPIR-V requirements", "extensions", "");
    }

    if (!spirvReq2->capabilities.empty()) {
        if (spirvReq1->capabilities.empty())
            spirvReq1->capabilities = spirvReq2->capabilities;
        else
            error(loc, "too many SPIR-V requirements", "capabilities", "");
    }

    return spirvReq1;
}